

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

void __thiscall CVmObjDate::CVmObjDate(CVmObjDate *this,int32_t dayno,uint32_t daytime)

{
  vm_date_ext *pvVar1;
  int32_t in_EDX;
  int32_t in_ESI;
  CVmObject *in_RDI;
  vm_date_ext *ext;
  
  CVmObject::CVmObject(in_RDI);
  in_RDI->_vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_003e4440;
  pvVar1 = vm_date_ext::alloc_ext((CVmObjDate *)in_RDI);
  in_RDI->ext_ = (char *)pvVar1;
  pvVar1->dayno = in_ESI;
  pvVar1->daytime = in_EDX;
  return;
}

Assistant:

CVmObjDate::CVmObjDate(VMG_ int32_t dayno, uint32_t daytime)
{
    /* allocate our extension structure */
    vm_date_ext *ext = vm_date_ext::alloc_ext(vmg_ this);
    ext_ = (char *)ext;

    /* fill it in */
    ext->dayno = dayno;
    ext->daytime = daytime;
}